

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O2

UnicodeString *
icu_63::TimeZone::getWindowsID(UnicodeString *id,UnicodeString *winid,UErrorCode *status)

{
  ushort uVar1;
  UErrorCode *pUVar2;
  bool bVar3;
  UBool UVar4;
  int8_t iVar5;
  ushort uVar6;
  UResType UVar7;
  UResourceBundle *pUVar8;
  UResourceBundle *fillIn;
  UChar *pUVar9;
  UChar *pUVar10;
  char *src;
  UChar *s;
  UChar *pUVar11;
  bool bVar12;
  UBool isSystemID;
  UErrorCode *local_e8;
  UResourceBundle *local_e0;
  ConstChar16Ptr local_d8;
  int32_t len;
  UnicodeString *local_c8;
  UChar *local_c0;
  UnicodeString canonicalID;
  UnicodeString local_70;
  
  uVar1 = (winid->fUnion).fStackFields.fLengthAndFlags;
  uVar6 = 2;
  if ((uVar1 & 1) == 0) {
    uVar6 = uVar1 & 0x1e;
  }
  (winid->fUnion).fStackFields.fLengthAndFlags = uVar6;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    canonicalID.super_Replaceable.super_UObject._vptr_UObject =
         (UObject)&PTR__UnicodeString_003a7268;
    canonicalID.fUnion.fStackFields.fLengthAndFlags = 2;
    isSystemID = '\0';
    getCanonicalID(id,&canonicalID,&isSystemID,status);
    if ((*status < U_ILLEGAL_ARGUMENT_ERROR) && (isSystemID != '\0')) {
      pUVar8 = ures_openDirect_63((char *)0x0,"windowsZones",status);
      ures_getByKey_63(pUVar8,"mapTimezones",pUVar8,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        fillIn = (UResourceBundle *)0x0;
        bVar12 = false;
        local_e8 = status;
        local_e0 = pUVar8;
        local_c8 = winid;
LAB_001f9462:
        while (((UVar4 = ures_hasNext_63(local_e0), !bVar12 && (UVar4 != '\0')) &&
               (fillIn = ures_getNextResource_63(local_e0,fillIn,local_e8),
               *local_e8 < U_ILLEGAL_ARGUMENT_ERROR))) {
          UVar7 = ures_getType_63(fillIn);
          bVar12 = false;
          if (UVar7 == RES_TABLE) {
            pUVar8 = (UResourceBundle *)0x0;
            bVar3 = false;
LAB_001f94b7:
            do {
              do {
                bVar12 = bVar3;
                UVar4 = ures_hasNext_63(fillIn);
                if (((bVar12) || (UVar4 == '\0')) ||
                   (pUVar8 = ures_getNextResource_63(fillIn,pUVar8,local_e8),
                   U_ZERO_ERROR < *local_e8)) goto LAB_001f95d0;
                UVar7 = ures_getType_63(pUVar8);
                pUVar2 = local_e8;
                bVar3 = false;
              } while (UVar7 != RES_STRING);
              pUVar9 = ures_getString_63(pUVar8,&len,local_e8);
              if (U_ZERO_ERROR < *pUVar2) goto LAB_001f95d0;
              bVar12 = false;
              s = pUVar9;
              do {
                if (bVar12) {
                  winid = local_c8;
                  bVar3 = false;
                  goto LAB_001f94b7;
                }
                pUVar10 = u_strchr_63(s,L' ');
                bVar12 = pUVar10 == (UChar *)0x0;
                pUVar11 = pUVar9 + len;
                if (!bVar12) {
                  pUVar11 = pUVar10;
                }
                local_d8.p_ = s;
                iVar5 = UnicodeString::compare
                                  (&canonicalID,&local_d8,
                                   (int32_t)((ulong)((long)pUVar11 - (long)s) >> 1));
                local_c0 = local_d8.p_;
                s = pUVar11 + 1;
              } while (iVar5 != '\0');
              src = ures_getKey_63(fillIn);
              UnicodeString::UnicodeString(&local_70,src,-1,kInvariant);
              winid = local_c8;
              UnicodeString::moveFrom(local_c8,&local_70);
              UnicodeString::~UnicodeString(&local_70);
              bVar3 = true;
            } while( true );
          }
        }
        pUVar8 = local_e0;
        ures_close_63(fillIn);
        ures_close_63(pUVar8);
      }
    }
    else if (*status == U_ILLEGAL_ARGUMENT_ERROR) {
      *status = U_ZERO_ERROR;
    }
    UnicodeString::~UnicodeString(&canonicalID);
  }
  return winid;
LAB_001f95d0:
  ures_close_63(pUVar8);
  goto LAB_001f9462;
}

Assistant:

UnicodeString&
TimeZone::getWindowsID(const UnicodeString& id, UnicodeString& winid, UErrorCode& status) {
    winid.remove();
    if (U_FAILURE(status)) {
        return winid;
    }

    // canonicalize the input ID
    UnicodeString canonicalID;
    UBool isSystemID = FALSE;

    getCanonicalID(id, canonicalID, isSystemID, status);
    if (U_FAILURE(status) || !isSystemID) {
        // mapping data is only applicable to tz database IDs
        if (status == U_ILLEGAL_ARGUMENT_ERROR) {
            // getWindowsID() sets an empty string where
            // getCanonicalID() sets a U_ILLEGAL_ARGUMENT_ERROR.
            status = U_ZERO_ERROR;
        }
        return winid;
    }

    UResourceBundle *mapTimezones = ures_openDirect(NULL, "windowsZones", &status);
    ures_getByKey(mapTimezones, "mapTimezones", mapTimezones, &status);

    if (U_FAILURE(status)) {
        return winid;
    }

    UResourceBundle *winzone = NULL;
    UBool found = FALSE;
    while (ures_hasNext(mapTimezones) && !found) {
        winzone = ures_getNextResource(mapTimezones, winzone, &status);
        if (U_FAILURE(status)) {
            break;
        }
        if (ures_getType(winzone) != URES_TABLE) {
            continue;
        }
        UResourceBundle *regionalData = NULL;
        while (ures_hasNext(winzone) && !found) {
            regionalData = ures_getNextResource(winzone, regionalData, &status);
            if (U_FAILURE(status)) {
                break;
            }
            if (ures_getType(regionalData) != URES_STRING) {
                continue;
            }
            int32_t len;
            const UChar *tzids = ures_getString(regionalData, &len, &status);
            if (U_FAILURE(status)) {
                break;
            }

            const UChar *start = tzids;
            UBool hasNext = TRUE;
            while (hasNext) {
                const UChar *end = u_strchr(start, (UChar)0x20);
                if (end == NULL) {
                    end = tzids + len;
                    hasNext = FALSE;
                }
                if (canonicalID.compare(start, static_cast<int32_t>(end - start)) == 0) {
                    winid = UnicodeString(ures_getKey(winzone), -1 , US_INV);
                    found = TRUE;
                    break;
                }
                start = end + 1;
            }
        }
        ures_close(regionalData);
    }
    ures_close(winzone);
    ures_close(mapTimezones);

    return winid;
}